

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll_set.cpp
# Opt level: O2

bool __thiscall miniros::PollSet::addEvents(PollSet *this,int sock,int events)

{
  _Rb_tree_header *p_Var1;
  iterator iVar2;
  __sighandler_t __handler;
  int __sig;
  uint events_00;
  allocator<char> local_55;
  int sock_local;
  string local_50;
  
  sock_local = sock;
  std::mutex::lock(&this->socket_info_mutex_);
  iVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_miniros::PollSet::SocketInfo>,_std::_Select1st<std::pair<const_int,_miniros::PollSet::SocketInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>_>
          ::find((_Rb_tree<int,_std::pair<const_int,_miniros::PollSet::SocketInfo>,_std::_Select1st<std::pair<const_int,_miniros::PollSet::SocketInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>_>
                  *)this,&sock_local);
  p_Var1 = &(this->socket_info_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar2._M_node == p_Var1) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (addEvents::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"miniros.poll_set",&local_55);
      console::initializeLogLocation(&addEvents::loc,&local_50,Debug);
      std::__cxx11::string::~string((string *)&local_50);
    }
    if (addEvents::loc.level_ != Debug) {
      console::setLogLocationLevel(&addEvents::loc,Debug);
      console::checkLogLocationEnabled(&addEvents::loc);
    }
    if (addEvents::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,addEvents::loc.logger_,addEvents::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/poll_set.cpp"
                     ,0x88,"bool miniros::PollSet::addEvents(int, int)",
                     "PollSet: Tried to add events [%d] to fd [%d] which does not exist in this pollset"
                     ,(ulong)(uint)events,(ulong)(uint)sock_local);
    }
  }
  else {
    events_00 = events | *(uint *)((long)&iVar2._M_node[2]._M_right + 4);
    *(uint *)((long)&iVar2._M_node[2]._M_right + 4) = events_00;
    __sig = sock_local;
    set_events_on_socket(this->epfd_,sock_local,events_00);
    this->sockets_changed_ = true;
    signal(this,__sig,__handler);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->socket_info_mutex_);
  return (_Rb_tree_header *)iVar2._M_node != p_Var1;
}

Assistant:

bool PollSet::addEvents(int sock, int events)
{
  std::scoped_lock<std::mutex> lock(socket_info_mutex_);

  M_SocketInfo::iterator it = socket_info_.find(sock);

  if (it == socket_info_.end())
  {
    MINIROS_DEBUG("PollSet: Tried to add events [%d] to fd [%d] which does not exist in this pollset", events, sock);
    return false;
  }

  it->second.events_ |= events;

  set_events_on_socket(epfd_, sock, it->second.events_);

  sockets_changed_ = true;
  signal();

  return true;
}